

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::ContainsSizedIntOrFloatType
          (ValidationState_t *this,uint32_t id,Op type,uint32_t width)

{
  function<bool_(const_spvtools::val::Instruction_*)> local_50;
  anon_class_8_2_25265493 local_2c;
  anon_class_8_2_25265493 f;
  uint32_t width_local;
  Op type_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  if ((type == OpTypeInt) || (type == OpTypeFloat)) {
    local_2c.type = type;
    local_2c.width = width;
    f.type = width;
    f.width = type;
    std::function<bool(spvtools::val::Instruction_const*)>::
    function<spvtools::val::ValidationState_t::ContainsSizedIntOrFloatType(unsigned_int,spv::Op,unsigned_int)const::__0_const&,void>
              ((function<bool(spvtools::val::Instruction_const*)> *)&local_50,&local_2c);
    this_local._7_1_ = ContainsType(this,id,&local_50,true);
    std::function<bool_(const_spvtools::val::Instruction_*)>::~function(&local_50);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::ContainsSizedIntOrFloatType(uint32_t id, spv::Op type,
                                                    uint32_t width) const {
  if (type != spv::Op::OpTypeInt && type != spv::Op::OpTypeFloat) return false;

  const auto f = [type, width](const Instruction* inst) {
    if (inst->opcode() == type) {
      return inst->GetOperandAs<uint32_t>(1u) == width;
    }
    return false;
  };
  return ContainsType(id, f);
}